

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example0.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  ostream *poVar19;
  char *pcVar20;
  char *pcVar21;
  double dVar22;
  Scalar d2;
  Scalar d1;
  Scalar d0;
  Point3 p2;
  Point3 p1;
  Point3 p6;
  Point3 p5;
  Point3 p4;
  Point3 p3;
  S_Sphere sphere;
  CD_Pair pair2;
  S_Superellipsoid super;
  S_Box box;
  CD_Pair pair3;
  CD_Pair pair1;
  string local_fa8;
  Vector3 local_f88;
  double local_f70;
  double local_f68;
  double local_f60;
  Vector3 local_f58;
  Vector3 local_f38;
  Vector3 local_f18;
  Vector3 local_ef8;
  Vector3 local_ed8;
  Vector3 local_eb8;
  S_Sphere local_ea0 [152];
  string local_e08 [32];
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  double local_9d8 [27];
  S_Box local_900 [168];
  Vector3 local_858 [43];
  double local_440 [130];
  
  *(undefined8 *)(sch::S_Box::~S_Box + *(long *)(std::cout + -0x18)) = 0xf;
  *(undefined8 *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = 0xf;
  sch::S_Box::S_Box(local_900,0.2,0.1,0.4);
  local_440[0] = 0.1;
  local_e08[0]._M_dataplus._M_p = (pointer)0x3fe6666666666666;
  local_858[0].m_x = 0.9;
  sch::S_Object::setPosition((double *)local_900,local_440,(double *)local_e08);
  local_440[0] = 0.1;
  local_e08[0]._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  local_858[0].m_x = 0.7;
  sch::S_Object::setOrientation((double *)local_900,local_440,(double *)local_e08);
  local_440[0] = 0.3;
  sch::S_Sphere::S_Sphere(local_ea0,local_440);
  local_440[0] = 0.5;
  local_e08[0]._M_dataplus._M_p = (pointer)0x3fe999999999999a;
  local_858[0].m_x = 1.1;
  sch::S_Object::addScale((double *)local_ea0,local_440,(double *)local_e08);
  local_440[0] = 0.1;
  local_e08[0]._M_dataplus._M_p = (pointer)0xbfe6666666666666;
  local_858[0].m_x = -0.9;
  sch::S_Object::setPosition((double *)local_ea0,local_440,(double *)local_e08);
  local_9f8 = 0x3fd314c3d92a9e91;
  uStack_9f0 = 0x3fe314c3d92a9e91;
  local_9e8 = 0x3fe7d9f4cf754635;
  local_440[0] = 0.8;
  sch::S_Object::addRotation((double *)local_ea0,(Vector3T *)local_440);
  sch::CD_Pair::CD_Pair((CD_Pair *)local_440,(S_Object *)local_900,(S_Object *)local_ea0);
  bVar2 = sch::CD_Pair::isInCollision();
  dVar22 = (double)sch::CD_Pair::getDistance();
  local_f60 = SQRT(ABS(dVar22));
  local_f38.m_z = 0.0;
  local_f38.m_x = 0.0;
  local_f38.m_y = 0.0;
  local_f58.m_z = 0.0;
  local_f58.m_x = 0.0;
  local_f58.m_y = 0.0;
  sch::CD_Pair::getClosestPoints((Vector3T *)local_440,(Vector3T *)&local_f38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"First Query",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Collision: ",0xb);
  pcVar20 = "False";
  pcVar21 = "False";
  if (bVar2 != 0) {
    pcVar21 = "True";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar21,(ulong)bVar2 ^ 5)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Distance: ",10);
  poVar19 = std::ostream::_M_insert<double>(local_f60);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Witness points: ",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P1: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_f38.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f38.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f38.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P2: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_f58.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f58.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f58.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_858[0].m_x = 1.75797057738;
  paVar1 = &local_e08[0].field_2;
  local_e08[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"First query, d0. ","");
  bVar3 = compare<double>(&local_f60,&local_858[0].m_x,local_e08,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e08[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e08[0]._M_dataplus._M_p,local_e08[0].field_2._M_allocated_capacity + 1);
  }
  local_858[0].m_x = 0.0292236259886;
  local_858[0].m_y = 0.601445137096;
  local_858[0].m_z = 0.705635281289;
  local_e08[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"First query, p1. ","");
  bVar4 = compare(&local_f38,local_858,local_e08,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e08[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e08[0]._M_dataplus._M_p,local_e08[0].field_2._M_allocated_capacity + 1);
  }
  local_858[0].m_x = 0.0239874216807;
  local_858[0].m_y = -0.336387177086;
  local_858[0].m_z = -0.781275504057;
  local_e08[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"First query, p2. ","");
  bVar5 = compare(&local_f58,local_858,local_e08,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e08[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e08[0]._M_dataplus._M_p,local_e08[0].field_2._M_allocated_capacity + 1);
  }
  local_e08[0]._M_dataplus._M_p = (pointer)0x0;
  local_858[0].m_x = 0.0;
  local_9d8[0] = 0.0;
  sch::S_Object::setPosition((double *)local_900,(double *)local_e08,&local_858[0].m_x);
  local_e08[0]._M_dataplus._M_p = (pointer)0x3f847ae147ae147b;
  local_858[0].m_x = 0.0;
  local_9d8[0] = 0.0;
  sch::S_Object::setPosition((double *)local_ea0,(double *)local_e08,&local_858[0].m_x);
  bVar2 = sch::CD_Pair::isInCollision();
  dVar22 = (double)sch::CD_Pair::getDistanceWithoutPenetrationDepth();
  local_f68 = SQRT(ABS(dVar22));
  dVar22 = (double)sch::CD_Pair::getDistance();
  local_f70 = SQRT(ABS(dVar22));
  sch::CD_Pair::getClosestPoints((Vector3T *)local_440,(Vector3T *)&local_f38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Second Query",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Collision: ",0xb);
  if (bVar2 != 0) {
    pcVar20 = "True";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar20,(ulong)bVar2 ^ 5)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Distance: ",10);
  poVar19 = std::ostream::_M_insert<double>(local_f68);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Depth: ",7);
  poVar19 = std::ostream::_M_insert<double>(local_f70);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Witness points: ",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P1: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_f38.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f38.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f38.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P2: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_f58.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f58.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f58.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_858[0].m_x = 0.0;
  local_e08[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"Second query, d1. ","");
  bVar6 = compare<double>(&local_f68,&local_858[0].m_x,local_e08,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e08[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e08[0]._M_dataplus._M_p,local_e08[0].field_2._M_allocated_capacity + 1);
  }
  local_858[0].m_x = 0.293744618861213;
  local_e08[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"Second query, d2. ","");
  bVar7 = compare<double>(&local_f70,&local_858[0].m_x,local_e08,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e08[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e08[0]._M_dataplus._M_p,local_e08[0].field_2._M_allocated_capacity + 1);
  }
  local_858[0].m_x = 0.0110146674327551;
  local_858[0].m_y = -0.0498945075944604;
  local_858[0].m_z = -0.0551780527427314;
  local_e08[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"Second query, p1. ","");
  bVar8 = compare(&local_f38,local_858,local_e08,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e08[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e08[0]._M_dataplus._M_p,local_e08[0].field_2._M_allocated_capacity + 1);
  }
  local_858[0].m_x = -0.158401731667896;
  local_858[0].m_y = 0.18954845401356;
  local_858[0].m_z = -0.0393334018450828;
  local_e08[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"Second query, p2. ","");
  bVar9 = compare(&local_f58,local_858,local_e08,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e08[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e08[0]._M_dataplus._M_p,local_e08[0].field_2._M_allocated_capacity + 1);
  }
  sch::S_Superellipsoid::S_Superellipsoid((S_Superellipsoid *)local_9d8,0.1,0.9,0.3,0.5,0.8);
  local_e08[0]._M_dataplus._M_p = (pointer)0x3fc999999999999a;
  local_858[0].m_x = 0.8;
  local_fa8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  sch::S_Object::setPosition(local_9d8,(double *)local_e08,&local_858[0].m_x);
  local_e08[0]._M_dataplus._M_p = (pointer)0x3fc999999999999a;
  local_858[0].m_x = 1.7;
  local_fa8._M_dataplus._M_p = (pointer)0x3fe999999999999a;
  sch::S_Object::setOrientation(local_9d8,(double *)local_e08,&local_858[0].m_x);
  sch::CD_Pair::CD_Pair((CD_Pair *)local_e08,(S_Object *)local_900,(S_Object *)local_9d8);
  sch::CD_Pair::CD_Pair((CD_Pair *)local_858,(S_Object *)local_ea0,(S_Object *)local_9d8);
  local_eb8.m_x = 0.0;
  local_eb8.m_y = 0.0;
  local_eb8.m_z = 0.0;
  local_ed8.m_z = 0.0;
  local_ed8.m_x = 0.0;
  local_ed8.m_y = 0.0;
  local_ef8.m_z = 0.0;
  local_ef8.m_x = 0.0;
  local_ef8.m_y = 0.0;
  local_f18.m_z = 0.0;
  local_f18.m_x = 0.0;
  local_f18.m_y = 0.0;
  local_f60 = (double)sch::CD_Pair::getClosestPoints((Vector3T *)local_440,(Vector3T *)&local_f38);
  local_f68 = (double)sch::CD_Pair::getClosestPoints((Vector3T *)local_e08,(Vector3T *)&local_eb8);
  local_f70 = (double)sch::CD_Pair::getClosestPoints((Vector3T *)local_858,(Vector3T *)&local_ef8);
  local_f88.m_x = -0.0862859011099191;
  paVar1 = &local_fa8.field_2;
  local_fa8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa8,"Third Query, d0","");
  bVar10 = compare<double>(&local_f60,&local_f88.m_x,&local_fa8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa8._M_dataplus._M_p != paVar1) {
    operator_delete(local_fa8._M_dataplus._M_p,local_fa8.field_2._M_allocated_capacity + 1);
  }
  local_f88.m_x = 0.0110146674327551;
  local_f88.m_y = -0.0498945075944604;
  local_f88.m_z = -0.0551780527427314;
  local_fa8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa8,"Third Query, p1","");
  bVar11 = compare(&local_f38,&local_f88,&local_fa8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa8._M_dataplus._M_p != paVar1) {
    operator_delete(local_fa8._M_dataplus._M_p,local_fa8.field_2._M_allocated_capacity + 1);
  }
  local_f88.m_x = -0.158401731667896;
  local_f88.m_y = 0.18954845401356;
  local_f88.m_z = -0.0393334018450828;
  local_fa8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa8,"Third Query, p2","");
  bVar12 = compare(&local_f58,&local_f88,&local_fa8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa8._M_dataplus._M_p != paVar1) {
    operator_delete(local_fa8._M_dataplus._M_p,local_fa8.field_2._M_allocated_capacity + 1);
  }
  local_f88.m_x = 0.659596933491;
  local_fa8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa8,"Third Query, d1","");
  bVar13 = compare<double>(&local_f68,&local_f88.m_x,&local_fa8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa8._M_dataplus._M_p != paVar1) {
    operator_delete(local_fa8._M_dataplus._M_p,local_fa8.field_2._M_allocated_capacity + 1);
  }
  local_f88.m_x = 0.0707763740114;
  local_f88.m_y = 0.0985548629043;
  local_f88.m_z = 0.194364718711;
  local_fa8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa8,"Third Query, p3","");
  bVar14 = compare(&local_eb8,&local_f88,&local_fa8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa8._M_dataplus._M_p != paVar1) {
    operator_delete(local_fa8._M_dataplus._M_p,local_fa8.field_2._M_allocated_capacity + 1);
  }
  local_f88.m_x = 0.259412979986;
  local_f88.m_y = 0.301096580075;
  local_f88.m_z = 0.95790254828;
  local_fa8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa8,"Third Query, p4","");
  bVar15 = compare(&local_ed8,&local_f88,&local_fa8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa8._M_dataplus._M_p != paVar1) {
    operator_delete(local_fa8._M_dataplus._M_p,local_fa8.field_2._M_allocated_capacity + 1);
  }
  local_f88.m_x = 0.516365498703901;
  local_fa8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa8,"Third Query, d2","");
  bVar16 = compare<double>(&local_f70,&local_f88.m_x,&local_fa8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa8._M_dataplus._M_p != paVar1) {
    operator_delete(local_fa8._M_dataplus._M_p,local_fa8.field_2._M_allocated_capacity + 1);
  }
  local_f88.m_x = 0.126586144900461;
  local_f88.m_y = 0.0390218116062935;
  local_f88.m_z = 0.297048794226006;
  local_fa8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa8,"Third Query, p5","");
  bVar17 = compare(&local_ef8,&local_f88,&local_fa8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa8._M_dataplus._M_p != paVar1) {
    operator_delete(local_fa8._M_dataplus._M_p,local_fa8.field_2._M_allocated_capacity + 1);
  }
  local_f88.m_x = 0.300323477842992;
  local_f88.m_y = 0.23919818987692;
  local_f88.m_z = 0.964963650647371;
  local_fa8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa8,"Third Query, p6","");
  bVar18 = compare(&local_f18,&local_f88,&local_fa8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa8._M_dataplus._M_p != paVar1) {
    operator_delete(local_fa8._M_dataplus._M_p,local_fa8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Third Query",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Distance1 Squared: ",0x13);
  poVar19 = std::ostream::_M_insert<double>(local_f60);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Witness points 1: ",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P1: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_f38.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f38.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f38.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P2: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_f58.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f58.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f58.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Distance2 Squared: ",0x13);
  poVar19 = std::ostream::_M_insert<double>(local_f68);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Witness points 2: ",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P1: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_eb8.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_eb8.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_eb8.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P2: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_ed8.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_ed8.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_ed8.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Distance3 Squared: ",0x13);
  poVar19 = std::ostream::_M_insert<double>(local_f70);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Witness points 3: ",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P1: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_ef8.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_ef8.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_ef8.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P2: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_f18.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f18.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f18.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  sch::CD_Pair::~CD_Pair((CD_Pair *)local_858);
  sch::CD_Pair::~CD_Pair((CD_Pair *)local_e08);
  sch::S_Superellipsoid::~S_Superellipsoid((S_Superellipsoid *)local_9d8);
  sch::CD_Pair::~CD_Pair((CD_Pair *)local_440);
  sch::S_Sphere::~S_Sphere(local_ea0);
  sch::S_Box::~S_Box(local_900);
  return (uint)((((!bVar16 || !bVar17) || !bVar18) || ((!bVar14 || !bVar15) || (!bVar12 || !bVar13))
                ) || ((!bVar10 || !bVar11) ||
                     (((!bVar7 || !bVar8) || !bVar9) || ((!bVar5 || !bVar6) || (!bVar3 || !bVar4))))
               );
}

Assistant:

int main(int /*argc*/, char * /*argv*/[])
{
#ifdef ENABLE_SIGFPE
  feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT);
#endif

  // Set output precision
  std::cout.precision(std::numeric_limits<double>::digits10);
  std::cerr.precision(std::numeric_limits<double>::digits10);

  //***********
  // Object initializations

  // A box with height, width and depth
  S_Box box(0.2, 0.1, 0.4);

  // Set the position in the world reference frame
  box.setPosition(0.1, 0.7, 0.9);

  // Set the orientation of the Object
  //(many different orientations representations are supported, here Roll
  //  pitch yaw)
  box.setOrientation(0.1, 1, 0.7);

  // A second object, a sphere with a radius
  S_Sphere sphere(0.3);

  // let's transform it into an ellipsoid
  // we add an anisotropic scale to the sphere
  //  (the scale has to be the first operation as it affects also
  //  rotations and translations)
  sphere.addScale(0.5, 0.8, 1.1);

  // Set the position in the world reference frame
  sphere.setPosition(0.1, -0.7, -0.9);

  // We turn it around the axis vrot defined by
  Vector3 vrot(0.2, 0.4, 0.5);
  vrot = vrot / vrot.norm();

  // let's turn it by 0.8 rad (we use addRotation instead of setRotation
  //  to not loose the scale)
  sphere.addRotation(0.8, vrot);

  //********
  // Proximity queries

  // Create a proximity-query pair of objects. It takes the addresses of the
  // objects. The user is responsible of guaranteeing the existance of the
  // objects at these addresses during all the period of use of the pair and
  // desrtoying the objects at the end.
  // Note that STL containers (vectors, deque, etc.) do not guarantee that
  // objects remain at same address. Use them with care.
  CD_Pair pair1(&box, &sphere);

  // Are they in collision ?
  // This is the fastest proximity query as it runs GJK with the lowest
  //  precision
  Scalar collision = pair1.isInCollision();

  // This runs GJK with 1e-6 precision.
  //  WARNING : THE PROVIDED DISTANCE IS SQUARED for computation time
  //  purpose, the real distance is then obtained by square root
  //  this algorithm takes profit from the warm start provided by the
  //  previous query, so there is virtually no additional cost at making
  //  these two requests instead of directly the last one.
  //  if there is a collision, this will compute the penetration depth
  Scalar d0 = sqrt(fabs(pair1.getDistance()));

  // Our witness points
  Point3 p1, p2;
  // get the Witness points without running GJK or depth computation again
  //  (it detects that the object did not move since the last query, if
  //  one or both moved, this query would trigger GJK algorithm).
  //  this method returns the distance also.
  pair1.getClosestPoints(p1, p2);

  // Let's display all this stuff
  std::cout << "First Query" << std::endl;
  std::cout << "Collision: " << (collision ? "True" : "False") << std::endl;
  std::cout << "Distance: " << d0 << std::endl;
  std::cout << "Witness points: " << std::endl;
  std::cout << "P1: " << p1 << std::endl;
  std::cout << "P2: " << p2 << std::endl;
  std::cout << std::endl;

  // compare the results for first query
  bool comparison = true;
  comparison = compare(d0, 1.75797057738, "First query, d0. ") && comparison;
  comparison =
      compare(p1, (Vector3(0.0292236259886, 0.601445137096, 0.705635281289)), "First query, p1. ") && comparison;
  comparison =
      compare(p2, (Vector3(0.0239874216807, -0.336387177086, -0.781275504057)), "First query, p2. ") && comparison;

  // Now we move the objects to enter in collision
  // We avoid symmetries to always get the same witness points.
  box.setPosition(0, 0, 0);
  sphere.setPosition(0.01, 0, 0);

  // Query again
  collision = pair1.isInCollision();

  // Let's run again the Distance computation, but not the penetration
  // depth, because the last algorithm is much slower, if there is a
  // collision, the output would be zero
  //
  Scalar d1 = sqrt(fabs(pair1.getDistanceWithoutPenetrationDepth()));

  // We call now the regular distance query (collision will trigger
  // depth query and the distance will be given in negative to distinguish
  //  it from separating distance)
  Scalar d2 = sqrt(fabs(pair1.getDistance()));

  // Our witness points
  pair1.getClosestPoints(p1, p2);

  // Let's display all this stuff
  std::cout << "Second Query" << std::endl;
  std::cout << "Collision: " << (collision ? "True" : "False") << std::endl;
  std::cout << "Distance: " << d1 << std::endl;
  std::cout << "Depth: " << d2 << std::endl;
  std::cout << "Witness points: " << std::endl;
  std::cout << "P1: " << p1 << std::endl;
  std::cout << "P2: " << p2 << std::endl;
  std::cout << std::endl;

  // compare the results for second query
  comparison = compare(d1, 0., "Second query, d1. ") && comparison;
#ifdef SCH_BUILD_BSD
  comparison = compare(d2, 0., "Second query, d2. ") && comparison;
  comparison =
      compare(p1, (Vector3(-0.211100297803413, -0.0866553324786505, -0.0206764992279858)), "Second query, p1. ")
      && comparison;
  comparison = compare(p2, (Vector3(0.201035958824805, -0.171232378087511, 0.066080909954798)), "Second query, p2. ")
               && comparison;
#else
  comparison = compare(d2, 0.293744618861213, "Second query, d2. ") && comparison;
  comparison =
      compare(p1, (Vector3(0.0110146674327551, -0.0498945075944604, -0.0551780527427314)), "Second query, p1. ")
      && comparison;
  comparison = compare(p2, (Vector3(-0.158401731667896, 0.18954845401356, -0.0393334018450828)), "Second query, p2. ")
               && comparison;
#endif

  //******************
  // More objects

  // Create the third object
  //  A superellipsoid with height, width, depth, epsilon1, epsilon2
  S_Superellipsoid super(0.1, 0.9, 0.3, 0.5, 0.8);

  // Position/Orientation
  super.setPosition(0.2, 0.8, 1);
  super.setOrientation(0.2, 1.7, 0.8);

  // Creation of new pairs related to the new objects. Each pair of 3D objects
  // is then a C++ objects
  CD_Pair pair2(&box, &super);
  CD_Pair pair3(&sphere, &super);

  // Our witness points
  Point3 p3, p4, p5, p6;

  // We can directly ask for the closest points
  // When the returned value is negative, it is the opposite of the squared
  // depth.
  d0 = pair1.getClosestPoints(p1, p2);
  d1 = pair2.getClosestPoints(p3, p4);
  d2 = pair3.getClosestPoints(p5, p6);

  // compare the results for third query
#ifdef SCH_BUILD_BSD
  comparison = compare(d0, 0., "Third Query, d0") && comparison;
  comparison = compare(p1, (Vector3(-0.211100297803413, -0.0866553324786505, -0.0206764992279858)), "Third Query, p1")
               && comparison;
  comparison =
      compare(p2, (Vector3(0.201035958824805, -0.171232378087511, 0.066080909954798)), "Third Query, p2") && comparison;
#else
  comparison = compare(d0, -0.0862859011099191, "Third Query, d0") && comparison;
  comparison = compare(p1, (Vector3(0.0110146674327551, -0.0498945075944604, -0.0551780527427314)), "Third Query, p1")
               && comparison;
  comparison = compare(p2, (Vector3(-0.158401731667896, 0.18954845401356, -0.0393334018450828)), "Third Query, p2")
               && comparison;
#endif

  comparison = compare(d1, 0.659596933491, "Third Query, d1") && comparison;
  comparison =
      compare(p3, (Vector3(0.0707763740114, 0.0985548629043, 0.194364718711)), "Third Query, p3") && comparison;
  comparison = compare(p4, (Vector3(0.259412979986, 0.301096580075, 0.95790254828)), "Third Query, p4") && comparison;

  comparison = compare(d2, 0.516365498703901, "Third Query, d2") && comparison;
  comparison = compare(p5, (sch::Vector3(0.126586144900461, 0.0390218116062935, 0.297048794226006)), "Third Query, p5")
               && comparison;
  comparison = compare(p6, (sch::Vector3(0.300323477842992, 0.23919818987692, 0.964963650647371)), "Third Query, p6")
               && comparison;

  // Let's display all this stuff
  std::cout << "Third Query" << std::endl;
  std::cout << "Distance1 Squared: " << d0 << std::endl;
  std::cout << "Witness points 1: " << std::endl;
  std::cout << "P1: " << p1 << std::endl;
  std::cout << "P2: " << p2 << std::endl;
  std::cout << "Distance2 Squared: " << d1 << std::endl;
  std::cout << "Witness points 2: " << std::endl;
  std::cout << "P1: " << p3 << std::endl;
  std::cout << "P2: " << p4 << std::endl;
  std::cout << "Distance3 Squared: " << d2 << std::endl;
  std::cout << "Witness points 3: " << std::endl;
  std::cout << "P1: " << p5 << std::endl;
  std::cout << "P2: " << p6 << std::endl;
  std::cout << std::endl;

  return (comparison ? 0 : 1);
  // That's all folks
}